

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbiftad.cpp
# Opt level: O3

void CVmBifTADS::restore(uint argc)

{
  long lVar1;
  void *pvVar2;
  int iVar3;
  err_id_t error_code;
  undefined4 extraout_var;
  FILE *pFVar4;
  CVmFile *fp;
  int __fd;
  vm_rcdesc *this;
  vm_val_t *__file;
  long *in_FS_OFFSET;
  err_frame_t err_cur__;
  vm_rcdesc rc;
  uint local_158 [2];
  long local_150;
  void *local_148;
  __jmp_buf_tag local_140;
  vm_rcdesc local_78;
  CVmNetFile *nf;
  
  CVmBif::check_argc(argc,1);
  __file = sp_ + -1;
  this = &local_78;
  vm_rcdesc::init(this,(EVP_PKEY_CTX *)"restoreGame");
  iVar3 = CVmNetFile::open((char *)__file,(int)this,1,0xf,"application/x-t3vm-state");
  __fd = (int)this;
  nf = (CVmNetFile *)CONCAT44(extraout_var,iVar3);
  G_err_frame::__tls_init();
  local_150 = *in_FS_OFFSET;
  G_err_frame::__tls_init();
  *in_FS_OFFSET = (long)local_158;
  local_158[0] = _setjmp(&local_140);
  if (local_158[0] == 0) {
    CVmObjFile::check_safety_for_open(nf,1);
    pFVar4 = fopen(nf->lclfname,"rb");
    if (pFVar4 == (FILE *)0x0) {
      err_throw(0x67);
    }
    fp = (CVmFile *)operator_new(0x10);
    fp->fp_ = (osfildef *)pFVar4;
    fp->seek_base_ = 0;
    error_code = CVmSaveFile::restore(fp);
    if (error_code != 0) {
      err_throw(error_code);
    }
    if ((short)local_158[0] < 0) goto LAB_0025982e;
    local_158[0] = local_158[0] | 0x8000;
    CVmFile::~CVmFile(fp);
    __fd = 0x10;
    operator_delete(fp,0x10);
  }
  else if (((short)local_158[0] < 0) ||
          (local_158[0] = local_158[0] | 0x8000, nf == (CVmNetFile *)0x0)) goto LAB_0025982e;
  CVmNetFile::close(nf,__fd);
LAB_0025982e:
  lVar1 = local_150;
  G_err_frame::__tls_init();
  *in_FS_OFFSET = lVar1;
  if ((local_158[0] & 0x4001) != 0) {
    G_err_frame::__tls_init();
    if ((*(byte *)*in_FS_OFFSET & 2) != 0) {
      G_err_frame::__tls_init();
      free(*(void **)(*in_FS_OFFSET + 0x10));
    }
    pvVar2 = local_148;
    G_err_frame::__tls_init();
    *(void **)(*in_FS_OFFSET + 0x10) = pvVar2;
    err_rethrow();
  }
  if ((local_158[0] & 2) != 0) {
    free(local_148);
  }
  sp_ = sp_ + -(long)(int)argc;
  CVmBif::retval_nil();
  return;
}

Assistant:

check_argc(vmg_ argc, 1);

    /* get the filename or spec */
    const vm_val_t *filespec = G_stk->get(0);

    /* set up for network storage server access, if applicable */
    vm_rcdesc rc(vmg_ "restoreGame", bif_table, 16, G_stk->get(0), argc);
    CVmNetFile *netfile = CVmNetFile::open(
        vmg_ filespec, &rc, NETF_READ, OSFTT3SAV, "application/x-t3vm-state");

    /* open the file and restore the game */
    CVmFile *file = 0;
    int err = 0;
    err_try
    {
        /* validate file safety */
        CVmObjFile::check_safety_for_open(vmg_ netfile, VMOBJFILE_ACCESS_READ);

        /* open the file */
        osfildef *fp = osfoprb(netfile->lclfname, OSFTT3SAV);
        if (fp == 0)
            err_throw(VMERR_FILE_NOT_FOUND);

        /* set up the file reader */
        file = new CVmFile(fp, 0);

        /* restore the state; throw an exception on error */
        if ((err = CVmSaveFile::restore(vmg_ file)) != 0)
            err_throw(err);
    }
    err_finally
    {
        /* close our local file */
        if (file != 0)
            delete file;

        /* close the network file */
        if (netfile != 0)
            netfile->close(vmg0_);
    }
    err_end;

    /* discard arguments */
    G_stk->discard(argc);

    /* no return value */
    retval_nil(vmg0_);
}

/*
 *   restart
 */
void CVmBifTADS::restart(VMG_ uint argc)
{
    /* check arguments */
    check_argc(vmg_ argc, 0);

    /* reset the VM to the image file's initial state */
    CVmSaveFile::reset(vmg0_);

    /* no return value */
    retval_nil(vmg0_);
}